

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

bool __thiscall
File::writeAttributeMap
          (File *this,
          map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
          *value)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  size_t sVar5;
  ByteString *pBVar6;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *p_Var7;
  unsigned_long uVar8;
  ByteString val;
  OSAttribute attr;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_100;
  OSAttribute local_d0;
  
  if (this->valid == true) {
    p_Var4 = (value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(value->_M_t)._M_impl.super__Rb_tree_header;
    uVar8 = 0;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        OSAttribute::OSAttribute(&local_d0,(OSAttribute *)&p_Var4[1]._M_parent);
        bVar2 = OSAttribute::isBooleanAttribute(&local_d0);
        if (bVar2) {
          uVar8 = uVar8 + 0x11;
        }
        else {
          bVar2 = OSAttribute::isUnsignedLongAttribute(&local_d0);
          if (bVar2) {
            uVar8 = uVar8 + 0x18;
          }
          else {
            bVar2 = OSAttribute::isByteStringAttribute(&local_d0);
            if (bVar2) {
              pBVar6 = OSAttribute::getByteStringValue(&local_d0);
              ByteString::ByteString((ByteString *)&local_100,pBVar6);
              sVar3 = ByteString::size((ByteString *)&local_100);
              uVar8 = uVar8 + sVar3 + 0x18;
              local_100._M_impl._0_8_ = &PTR__ByteString_00151bd0;
              std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                         &local_100._M_impl.super__Rb_tree_header);
            }
            else {
              bVar2 = OSAttribute::isMechanismTypeSetAttribute(&local_d0);
              if (!bVar2) goto LAB_00136a82;
              p_Var7 = &OSAttribute::getMechanismTypeSetValue(&local_d0)->_M_t;
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::_Rb_tree(&local_100,p_Var7);
              uVar8 = uVar8 + local_100._M_impl.super__Rb_tree_header._M_node_count * 8 + 0x18;
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::~_Rb_tree(&local_100);
            }
          }
        }
        OSAttribute::~OSAttribute(&local_d0);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    bVar2 = writeULong(this,uVar8);
    if (bVar2) {
      p_Var4 = (value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var4 == p_Var1) {
        return true;
      }
      while( true ) {
        OSAttribute::OSAttribute(&local_d0,(OSAttribute *)&p_Var4[1]._M_parent);
        bVar2 = writeULong(this,*(unsigned_long *)(p_Var4 + 1));
        if (!bVar2) break;
        bVar2 = OSAttribute::isBooleanAttribute(&local_d0);
        if (bVar2) {
          bVar2 = writeULong(this,1);
          if ((!bVar2) || (bVar2 = OSAttribute::getBooleanValue(&local_d0), this->valid == false))
          break;
          local_100._M_impl._0_1_ = -bVar2;
          sVar5 = fwrite(&local_100,1,1,(FILE *)this->stream);
          if (sVar5 != 1) break;
        }
        else {
          bVar2 = OSAttribute::isUnsignedLongAttribute(&local_d0);
          if (bVar2) {
            bVar2 = writeULong(this,2);
            if (!bVar2) break;
            uVar8 = OSAttribute::getUnsignedLongValue(&local_d0);
            bVar2 = writeULong(this,uVar8);
            if (!bVar2) break;
          }
          else {
            bVar2 = OSAttribute::isByteStringAttribute(&local_d0);
            if (bVar2) {
              bVar2 = writeULong(this,3);
              if (!bVar2) break;
              pBVar6 = OSAttribute::getByteStringValue(&local_d0);
              ByteString::ByteString((ByteString *)&local_100,pBVar6);
              bVar2 = writeByteString(this,(ByteString *)&local_100);
              local_100._M_impl._0_8_ = &PTR__ByteString_00151bd0;
              std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                         &local_100._M_impl.super__Rb_tree_header);
            }
            else {
              bVar2 = OSAttribute::isMechanismTypeSetAttribute(&local_d0);
              if (!bVar2) goto LAB_00136a64;
              bVar2 = writeULong(this,5);
              if (!bVar2) break;
              p_Var7 = &OSAttribute::getMechanismTypeSetValue(&local_d0)->_M_t;
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::_Rb_tree(&local_100,p_Var7);
              bVar2 = writeMechanismTypeSet
                                (this,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                       *)&local_100);
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::~_Rb_tree(&local_100);
            }
            if (bVar2 == false) break;
          }
        }
LAB_00136a64:
        OSAttribute::~OSAttribute(&local_d0);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        if ((_Rb_tree_header *)p_Var4 == p_Var1) {
          return true;
        }
      }
LAB_00136a82:
      OSAttribute::~OSAttribute(&local_d0);
    }
  }
  return false;
}

Assistant:

bool File::writeAttributeMap(const std::map<CK_ATTRIBUTE_TYPE,OSAttribute>& value)
{
	if (!valid) return false;

	// compute length
	unsigned long len = 0;
	for (std::map<CK_ATTRIBUTE_TYPE,OSAttribute>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		OSAttribute attr = i->second;
		// count attribute type and kind
		len += 8 + 8;

		if (attr.isBooleanAttribute())
		{
			len += 1;
		}
		else if (attr.isUnsignedLongAttribute())
		{
			len += 8;
		}
		else if (attr.isByteStringAttribute())
		{
			ByteString val = attr.getByteStringValue();
			len += 8 + val.size();
		}
		else if (attr.isMechanismTypeSetAttribute())
		{
			std::set<CK_MECHANISM_TYPE> val = attr.getMechanismTypeSetValue();
			len += 8 + val.size() * 8;
		}
		else
		{
			return false;
		}
	}

	// write length
	if (!writeULong(len))
	{
		return false;
	}

	// write each attribute
	for (std::map<CK_ATTRIBUTE_TYPE,OSAttribute>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		OSAttribute attr = i->second;
		unsigned long attrType = (unsigned long) i->first;
		if (!writeULong(attrType))
		{
			return false;
		}

		if (attr.isBooleanAttribute())
		{
			unsigned long attrKind = akBoolean;
			if (!writeULong(attrKind))
			{
				return false;
			}

			bool val = attr.getBooleanValue();
			if (!writeBool(val))
			{
				return false;
			}
		}
		else if (attr.isUnsignedLongAttribute())
		{
			unsigned long attrKind = akInteger;
			if (!writeULong(attrKind))
			{
				return false;
			}

			unsigned long val = attr.getUnsignedLongValue();
			if (!writeULong(val))
			{
				return false;
			}
		}
		else if (attr.isByteStringAttribute())
		{
			unsigned long attrKind = akBinary;
			if (!writeULong(attrKind))
			{
				return false;
			}

			ByteString val = attr.getByteStringValue();
			if (!writeByteString(val))
			{
				return false;
			}
		}
		else if (attr.isMechanismTypeSetAttribute())
		{
			unsigned long attrKind = akMechSet;
			if (!writeULong(attrKind))
			{
				return false;
			}

			std::set<CK_MECHANISM_TYPE> val = attr.getMechanismTypeSetValue();
			if (!writeMechanismTypeSet(val))
			{
				return false;
			}
		}
	}

	return true;
}